

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O0

int wally_base58_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,char **output)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  uint local_294;
  uint local_288;
  int local_284;
  uint32_t carry;
  int ret;
  size_t orig_len;
  size_t i;
  size_t zeros;
  size_t bn_bytes;
  uchar *bn_p;
  uchar *top_byte;
  uchar *bn;
  uchar bn_buf [512];
  long local_40;
  uint32_t *cs_p;
  char **ppcStack_30;
  uint32_t checksum;
  char **output_local;
  size_t sStack_20;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  local_40 = 0;
  top_byte = (uchar *)&bn;
  zeros = 0;
  local_284 = -2;
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  ppcStack_30 = output;
  output_local._4_4_ = flags;
  sStack_20 = bytes_len;
  bytes_len_local = (size_t)bytes;
  if ((((bytes != (uchar *)0x0) && (bytes_len != 0)) && ((flags & 0xfffffffe) == 0)) &&
     (output != (char **)0x0)) {
    if ((flags & 1) != 0) {
      cs_p._4_4_ = base58_get_checksum(bytes,bytes_len);
      local_40 = (long)&cs_p + 4;
      sStack_20 = sStack_20 + 4;
    }
    i = 0;
    while( true ) {
      bVar5 = false;
      if (i < sStack_20) {
        if (i < bytes_len) {
          cVar1 = *(char *)(bytes_len_local + i);
        }
        else {
          cVar1 = *(char *)(local_40 + (i - bytes_len));
        }
        bVar5 = cVar1 == '\0';
      }
      if (!bVar5) break;
      i = i + 1;
    }
    if (i == sStack_20) {
      pcVar3 = (char *)wally_malloc(i + 1);
      *ppcStack_30 = pcVar3;
      if (pcVar3 != (char *)0x0) {
        memset(*ppcStack_30,0x31,i);
        (*ppcStack_30)[i] = '\0';
        return 0;
      }
      local_284 = -3;
    }
    else {
      uVar4 = ((sStack_20 - i) * 0x8a) / 100;
      zeros = uVar4 + 1;
      if ((zeros < 0x201) || (top_byte = (uchar *)wally_malloc(zeros), top_byte != (uchar *)0x0)) {
        bn_p = top_byte + uVar4;
        *bn_p = '\0';
        for (orig_len = i; orig_len < sStack_20; orig_len = orig_len + 1) {
          if (orig_len < bytes_len) {
            bVar2 = *(byte *)(bytes_len_local + orig_len);
          }
          else {
            bVar2 = *(byte *)(local_40 + (orig_len - bytes_len));
          }
          local_294 = (uint)bVar2;
          local_288 = local_294;
          bn_bytes = (size_t)(top_byte + zeros);
          while (bn_bytes = bn_bytes - 1, bn_p <= bn_bytes) {
            local_288 = (uint)*(byte *)bn_bytes * 0x100 + local_288;
            *(char *)bn_bytes = (char)((ulong)local_288 % 0x3a);
            local_288 = local_288 / 0x3a;
            if ((local_288 != 0) && ((uchar *)bn_bytes == bn_p)) {
              bn_p[-1] = '\0';
              bn_p = bn_p + -1;
            }
          }
        }
        for (; *bn_p == '\0' && bn_p < top_byte + uVar4; bn_p = bn_p + 1) {
        }
        zeros = (size_t)(top_byte + (zeros - (long)bn_p));
        pcVar3 = (char *)wally_malloc((size_t)(zeros + i + 1));
        *ppcStack_30 = pcVar3;
        if (pcVar3 == (char *)0x0) {
          local_284 = -3;
        }
        else {
          memset(*ppcStack_30,0x31,i);
          for (orig_len = 0; orig_len < zeros; orig_len = orig_len + 1) {
            (*ppcStack_30)[i + orig_len] =
                 "123456789ABCDEFGHJKLMNPQRSTUVWXYZabcdefghijkmnopqrstuvwxyz"[bn_p[orig_len]];
          }
          (*ppcStack_30)[(long)(zeros + i)] = '\0';
          local_284 = 0;
        }
      }
      else {
        local_284 = -3;
      }
    }
  }
  if ((top_byte != (uchar *)0x0) && (wally_clear(top_byte,zeros), (uchar **)top_byte != &bn)) {
    wally_free(top_byte);
  }
  return local_284;
}

Assistant:

int wally_base58_from_bytes(const unsigned char *bytes, size_t bytes_len,
                            uint32_t flags, char **output)
{
    uint32_t checksum, *cs_p = NULL;
    unsigned char bn_buf[BIGNUM_BYTES];
    unsigned char *bn = bn_buf, *top_byte, *bn_p;
    size_t bn_bytes = 0, zeros, i, orig_len = bytes_len;
    int ret = WALLY_EINVAL;

    if (output)
        *output = NULL;

    if (!bytes || !bytes_len || (flags & ~BASE58_ALL_DEFINED_FLAGS) || !output)
        goto cleanup; /* Invalid argument */

    if (flags & BASE58_FLAG_CHECKSUM) {
        checksum = base58_get_checksum(bytes, bytes_len);
        cs_p = &checksum;
        bytes_len += 4;
    }

#define b(n) (n < orig_len ? bytes[n] : ((unsigned char *)cs_p)[n - orig_len])

    /* Process leading zeros */
    for (zeros = 0; zeros < bytes_len && !b(zeros); ++zeros)
        ; /* no-op*/

    if (zeros == bytes_len) {
        if (!(*output = wally_malloc(zeros + 1))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

        memset(*output, '1', zeros);
        (*output)[zeros] = '\0';
        return WALLY_OK; /* All 0's */
    }

    bn_bytes = (bytes_len - zeros) * 138 / 100 + 1; /* log(256)/log(58) rounded up */

    /* Allocate our bignum buffer if it won't fit on the stack */
    if (bn_bytes > BIGNUM_BYTES)
        if (!(bn = wally_malloc(bn_bytes))) {
            ret = WALLY_ENOMEM;
            goto cleanup;
        }

    top_byte = bn + bn_bytes - 1;
    *top_byte = 0;

    for (i = zeros; i < bytes_len; ++i) {
        uint32_t carry = b(i);
        for (bn_p = bn + bn_bytes - 1; bn_p >= top_byte; --bn_p) {
            carry = *bn_p * 256 + carry;
            *bn_p = carry % 58;
            carry = carry / 58;
            if (carry && bn_p == top_byte)
                *--top_byte = 0; /* Increase bignum size */
        }
    }

    while (!*top_byte && top_byte < bn + bn_bytes - 1)
        ++top_byte; /* Skip leading zero bytes in our bignum */

    /* Copy the result */
    bn_bytes = bn + bn_bytes - top_byte;

    if (!(*output = wally_malloc(zeros + bn_bytes + 1))) {
        ret = WALLY_ENOMEM;
        goto cleanup;
    }

    memset(*output, '1', zeros);
    for (i = 0; i < bn_bytes; ++i)
        (*output)[zeros + i] = byte_to_base58[top_byte[i]];
    (*output)[zeros + bn_bytes] = '\0';

    ret = WALLY_OK;

cleanup:
    if (bn) {
        wally_clear(bn, bn_bytes);
        if (bn != bn_buf)
            wally_free(bn);
    }
    return ret;
#undef b
}